

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void wstran_pipe_recv_cb(void *arg)

{
  nni_aio *aio;
  nng_err result;
  nni_msg *m;
  nni_msg *msg;
  int rv;
  nni_aio *uaio;
  nni_aio *raio;
  ws_pipe *p;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)arg);
  aio = *(nni_aio **)((long)arg + 0x38);
  *(undefined8 *)((long)arg + 0x38) = 0;
  result = nni_aio_result((nni_aio *)((long)arg + 0x208));
  if (result == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x208));
    if (aio == (nni_aio *)0x0) {
      nni_msg_free(m);
    }
    else {
      nni_aio_finish_msg(aio,m);
    }
  }
  else if (aio != (nni_aio *)0x0) {
    nni_aio_finish_error(aio,result);
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
wstran_pipe_recv_cb(void *arg)
{
	ws_pipe *p    = arg;
	nni_aio *raio = &p->rxaio;
	nni_aio *uaio;
	int      rv;

	nni_mtx_lock(&p->mtx);
	uaio          = p->user_rxaio;
	p->user_rxaio = NULL;
	if ((rv = nni_aio_result(raio)) != 0) {
		if (uaio != NULL) {
			nni_aio_finish_error(uaio, rv);
		}
	} else {
		nni_msg *msg = nni_aio_get_msg(raio);
		if (uaio != NULL) {
			nni_aio_finish_msg(uaio, msg);
		} else {
			nni_msg_free(msg);
		}
	}
	nni_mtx_unlock(&p->mtx);
}